

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

ssize_t __thiscall jaegertracing::thrift::Log::write(Log *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  reference pTVar6;
  undefined4 in_register_00000034;
  TProtocol *prot;
  __normal_iterator<const_jaegertracing::thrift::Tag_*,_std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>_>
  local_50;
  Tag *local_48;
  __normal_iterator<const_jaegertracing::thrift::Tag_*,_std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>_>
  local_40;
  const_iterator _iter8;
  TOutputRecursionTracker local_28;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *oprot_local;
  Log *this_local;
  
  prot = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  tracker.prot_._4_4_ = 0;
  apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker(&local_28,prot);
  uVar2 = apache::thrift::protocol::TProtocol::writeStructBegin(prot,"Log");
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"timestamp",T_I64,1);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeI64(prot,this->timestamp);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"fields",T_LIST,2);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  sVar5 = std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::size
                    (&this->fields);
  uVar2 = apache::thrift::protocol::TProtocol::writeListBegin(prot,T_STRUCT,(uint32_t)sVar5);
  tracker.prot_._4_4_ = uVar2 + tracker.prot_._4_4_;
  __gnu_cxx::
  __normal_iterator<const_jaegertracing::thrift::Tag_*,_std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>_>
  ::__normal_iterator(&local_40);
  local_48 = (Tag *)std::
                    vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
                    ::begin(&this->fields);
  local_40._M_current = local_48;
  while( true ) {
    local_50._M_current =
         (Tag *)std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
                ::end(&this->fields);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    pTVar6 = __gnu_cxx::
             __normal_iterator<const_jaegertracing::thrift::Tag_*,_std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>_>
             ::operator*(&local_40);
    iVar3 = (**(code **)(*(long *)pTVar6 + 0x18))(pTVar6,prot);
    tracker.prot_._4_4_ = iVar3 + tracker.prot_._4_4_;
    __gnu_cxx::
    __normal_iterator<const_jaegertracing::thrift::Tag_*,_std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>_>
    ::operator++(&local_40);
  }
  uVar2 = apache::thrift::protocol::TProtocol::writeListEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldStop(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeStructEnd(prot);
  uVar4 = uVar2 + tracker.prot_._4_4_;
  tracker.prot_._4_4_ = uVar4;
  apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker(&local_28);
  return (ulong)uVar4;
}

Assistant:

uint32_t Log::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("Log");

  xfer += oprot->writeFieldBegin("timestamp", ::apache::thrift::protocol::T_I64, 1);
  xfer += oprot->writeI64(this->timestamp);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("fields", ::apache::thrift::protocol::T_LIST, 2);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->fields.size()));
    std::vector<Tag> ::const_iterator _iter8;
    for (_iter8 = this->fields.begin(); _iter8 != this->fields.end(); ++_iter8)
    {
      xfer += (*_iter8).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}